

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O0

void __thiscall
HuffmanNode::HuffmanNode
          (HuffmanNode *this,shared_ptr<HuffmanNode> *left,shared_ptr<HuffmanNode> *right)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  shared_ptr<HuffmanNode> *right_local;
  shared_ptr<HuffmanNode> *left_local;
  HuffmanNode *this_local;
  
  this->c_ = '0';
  std::shared_ptr<HuffmanNode>::shared_ptr(&this->left_);
  std::shared_ptr<HuffmanNode>::shared_ptr(&this->right_);
  peVar3 = std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      left);
  iVar1 = get_n(peVar3);
  peVar3 = std::__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<HuffmanNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      right);
  iVar2 = get_n(peVar3);
  this->n_ = iVar1 + iVar2;
  std::shared_ptr<HuffmanNode>::operator=(&this->left_,left);
  std::shared_ptr<HuffmanNode>::operator=(&this->right_,right);
  return;
}

Assistant:

HuffmanNode::HuffmanNode(const shared_ptr<HuffmanNode>& left,
                         const shared_ptr<HuffmanNode>& right) : c_('0') {
  this->n_ = left->get_n() + right->get_n();
  this->left_ = left;
  this->right_ = right;
}